

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::SortedAggregateBindData::SortedAggregateBindData
          (SortedAggregateBindData *this,ClientContext *context_p,Expressions *children,
          AggregateFunction *aggregate,BindInfoPtr *bind_info,OrderBys *order_bys)

{
  vector<duckdb::LogicalType,_true> *this_00;
  vector<duckdb::LogicalType,_true> *this_01;
  pointer puVar1;
  pointer pBVar2;
  uint uVar3;
  ClientConfig *pCVar4;
  pointer pEVar5;
  reference pvVar6;
  reference this_02;
  reference pvVar7;
  type pEVar8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer this_03;
  ulong __n;
  pointer this_04;
  bool bVar9;
  Expressions *__range2;
  ListSegmentFunctions funcs;
  
  (this->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__SortedAggregateBindData_0279b110;
  this->context = context_p;
  AggregateFunction::AggregateFunction(&this->function,aggregate);
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bind_info).
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (bind_info->
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (bind_info->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>).
  _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
  this_00 = &this->arg_types;
  this_01 = &this->sort_types;
  (this->sort_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sort_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sort_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sort_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sort_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sort_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arg_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arg_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arg_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar4 = ClientConfig::GetConfig(this->context);
  this->threshold = pCVar4->ordered_aggregate_threshold;
  pCVar4 = ClientConfig::GetConfig(this->context);
  this->external = pCVar4->force_external;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (long)(children->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(children->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  reserve(&(this->arg_funcs).
           super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
          ,(long)(children->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(children->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (children->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_03 = (children->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_03 != puVar1; this_03 = this_03 + 1
      ) {
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_03);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_00,
               &pEVar5->return_type);
    funcs.initial_capacity = 4;
    funcs.child_functions.
    super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    funcs.child_functions.
    super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    funcs.child_functions.
    super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar6 = vector<duckdb::LogicalType,_true>::back(this_00);
    GetSegmentDataFunctions(&funcs,pvVar6);
    ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
    emplace_back<duckdb::ListSegmentFunctions>
              (&(this->arg_funcs).
                super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
               ,&funcs);
    ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
    ~vector(&funcs.child_functions.
             super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
           );
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             ((long)(order_bys->
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ).
                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(order_bys->
                   super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   ).
                   super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  reserve(&(this->sort_funcs).
           super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
          ,((long)(order_bys->
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>)
                  .
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(order_bys->
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pBVar2 = (order_bys->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_04 = (order_bys->
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_04 != pBVar2; this_04 = this_04 + 1
      ) {
    BoundOrderByNode::Copy((BoundOrderByNode *)&funcs,this_04);
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
    emplace_back<duckdb::BoundOrderByNode>
              (&(this->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
               (BoundOrderByNode *)&funcs);
    BoundOrderByNode::~BoundOrderByNode((BoundOrderByNode *)&funcs);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_04->expression);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
               &pEVar5->return_type);
    funcs.initial_capacity = 4;
    funcs.child_functions.
    super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    funcs.child_functions.
    super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    funcs.child_functions.
    super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar6 = vector<duckdb::LogicalType,_true>::back(this_01);
    GetSegmentDataFunctions(&funcs,pvVar6);
    ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
    emplace_back<duckdb::ListSegmentFunctions>
              (&(this->sort_funcs).
                super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
               ,&funcs);
    ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
    ~vector(&funcs.child_functions.
             super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
           );
  }
  bVar9 = (long)(children->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(children->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3 ==
          ((long)(order_bys->
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(order_bys->
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar3 = (uint)bVar9;
  this->sorted_on_args = bVar9;
  for (__n = 0; ((uVar3 & 1) != 0 &&
                (__n < (ulong)((long)(children->
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(children->
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3)));
      __n = __n + 1) {
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(children,__n);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    pvVar7 = vector<duckdb::BoundOrderByNode,_true>::get<true>(order_bys,__n);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pvVar7->expression);
    uVar3 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[10])(pEVar5,pEVar8);
    this->sorted_on_args = SUB41(uVar3,0);
  }
  return;
}

Assistant:

SortedAggregateBindData(ClientContext &context_p, Expressions &children, AggregateFunction &aggregate,
	                        BindInfoPtr &bind_info, OrderBys &order_bys)
	    : context(context_p), function(aggregate), bind_info(std::move(bind_info)),
	      threshold(ClientConfig::GetConfig(context).ordered_aggregate_threshold),
	      external(ClientConfig::GetConfig(context).force_external) {
		arg_types.reserve(children.size());
		arg_funcs.reserve(children.size());
		for (const auto &child : children) {
			arg_types.emplace_back(child->return_type);
			ListSegmentFunctions funcs;
			GetSegmentDataFunctions(funcs, arg_types.back());
			arg_funcs.emplace_back(std::move(funcs));
		}
		sort_types.reserve(order_bys.size());
		sort_funcs.reserve(order_bys.size());
		for (auto &order : order_bys) {
			orders.emplace_back(order.Copy());
			sort_types.emplace_back(order.expression->return_type);
			ListSegmentFunctions funcs;
			GetSegmentDataFunctions(funcs, sort_types.back());
			sort_funcs.emplace_back(std::move(funcs));
		}
		sorted_on_args = (children.size() == order_bys.size());
		for (size_t i = 0; sorted_on_args && i < children.size(); ++i) {
			sorted_on_args = children[i]->Equals(*order_bys[i].expression);
		}
	}